

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AstCompiler.cpp
# Opt level: O2

void __thiscall compiler::CompilerAstWalker::popEmissionContext(CompilerAstWalker *this)

{
  string local_50;
  undefined1 local_30 [8];
  shared_ptr<compiler::EmissionContext> outer;
  
  std::__shared_ptr<compiler::EmissionContext,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<compiler::EmissionContext,_(__gnu_cxx::_Lock_policy)2> *)local_30,
             &(((this->ec).super___shared_ptr<compiler::EmissionContext,_(__gnu_cxx::_Lock_policy)2>
               ._M_ptr)->outerContext).
              super___shared_ptr<compiler::EmissionContext,_(__gnu_cxx::_Lock_policy)2>);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_50,"popEmissionContext called when outer context is none!",
             (allocator<char> *)
             ((long)&outer.super___shared_ptr<compiler::EmissionContext,_(__gnu_cxx::_Lock_policy)2>
                     ._M_refcount._M_pi + 7));
  Error::assertWithPanic(local_30 != (undefined1  [8])0x0,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  std::__shared_ptr<compiler::EmissionContext,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->ec).super___shared_ptr<compiler::EmissionContext,_(__gnu_cxx::_Lock_policy)2>,
             (__shared_ptr<compiler::EmissionContext,_(__gnu_cxx::_Lock_policy)2> *)local_30);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&outer);
  return;
}

Assistant:

void popEmissionContext() noexcept {
    auto outer = this->ec->outerContext;
    Error::assertWithPanic(outer != nullptr, "popEmissionContext called when outer context is none!");
    this->ec = outer;
  }